

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O2

void aes_cbc_ni_encrypt(ssh_cipher *ciph,void *vblk,int blklen,aes_ni_fn encrypt)

{
  undefined4 in_register_00000014;
  __m128i *palVar1;
  undefined4 *puVar2;
  uint8_t *blk;
  undefined4 *puVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128i alVar4;
  
  palVar1 = (__m128i *)CONCAT44(in_register_00000014,blklen);
  puVar2 = (undefined4 *)((long)blklen + (long)vblk);
  for (puVar3 = (undefined4 *)vblk; puVar3 < puVar2; puVar3 = puVar3 + 4) {
    alVar4[1] = (longlong)vblk;
    alVar4[0] = (longlong)(ciph + -0x3f);
    alVar4 = (*encrypt)(alVar4,palVar1);
    palVar1 = alVar4[1];
    *puVar3 = extraout_XMM0_Da;
    puVar3[1] = extraout_XMM0_Db;
    puVar3[2] = extraout_XMM0_Dc;
    puVar3[3] = extraout_XMM0_Dd;
    *(undefined4 *)&ciph[-3].vt = extraout_XMM0_Da;
    *(undefined4 *)((long)&ciph[-3].vt + 4) = extraout_XMM0_Db;
    *(undefined4 *)&ciph[-2].vt = extraout_XMM0_Dc;
    *(undefined4 *)((long)&ciph[-2].vt + 4) = extraout_XMM0_Dd;
  }
  return;
}

Assistant:

static inline void aes_cbc_ni_encrypt(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn encrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i plaintext = _mm_loadu_si128((const __m128i *)blk);
        __m128i cipher_input = _mm_xor_si128(plaintext, ctx->iv);
        __m128i ciphertext = encrypt(cipher_input, ctx->keysched_e);
        _mm_storeu_si128((__m128i *)blk, ciphertext);
        ctx->iv = ciphertext;
    }
}